

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O0

void ifft3d(float *data,long M3,long M2,long M)

{
  float *data_00;
  long M_00;
  byte bVar1;
  float *in_RCX;
  xdouble *in_RDX;
  long in_RSI;
  xdouble *in_RDI;
  long N3;
  long N2;
  long N;
  long i2;
  long i1;
  long in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffd0;
  long Ncols;
  long in_stack_ffffffffffffffd8;
  ulong Nrows;
  
  bVar1 = (byte)in_RCX;
  data_00 = (float *)(1L << ((byte)in_RDX & 0x3f));
  M_00 = 1L << ((byte)in_RSI & 0x3f);
  if (((in_RSI < 1) || ((long)in_RDX < 1)) || ((long)in_RCX < 1)) {
    if (in_RSI == 0) {
      ifft2d(in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    }
    else if (in_RDX == (xdouble *)0x0) {
      ifft2d(in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    }
    else if (in_RCX == (float *)0x0) {
      ifft2d((float *)0x0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    }
  }
  else {
    iffts(data_00,M_00,in_stack_ffffffffffffffb0);
    if ((long)in_RCX < 3) {
      for (Ncols = 0; Ncols < M_00; Ncols = Ncols + 1) {
        dxpose(in_RDI,in_RSI,in_RDX,(long)in_RCX,in_stack_ffffffffffffffd8,Ncols);
        iffts(data_00,M_00,in_stack_ffffffffffffffb0);
        dxpose(in_RDI,in_RSI,in_RDX,(long)in_RCX,in_stack_ffffffffffffffd8,Ncols);
      }
    }
    else {
      for (Ncols = 0; Ncols < M_00; Ncols = Ncols + 1) {
        for (in_stack_ffffffffffffffd8 = 0; in_stack_ffffffffffffffd8 < 1L << (bVar1 & 0x3f);
            in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + 4) {
          dxpose(in_RDI,in_RSI,in_RDX,(long)in_RCX,in_stack_ffffffffffffffd8,Ncols);
          iffts(data_00,M_00,in_stack_ffffffffffffffb0);
          dxpose(in_RDI,in_RSI,in_RDX,(long)in_RCX,in_stack_ffffffffffffffd8,Ncols);
        }
      }
    }
    if ((long)in_RDX + (long)in_RCX < 3) {
      dxpose(in_RDI,in_RSI,in_RDX,(long)in_RCX,in_stack_ffffffffffffffd8,Ncols);
      iffts(data_00,M_00,in_stack_ffffffffffffffb0);
      dxpose(in_RDI,in_RSI,in_RDX,(long)in_RCX,in_stack_ffffffffffffffd8,Ncols);
    }
    else {
      for (Nrows = 0; Nrows < (ulong)(1L << ((char)in_RDX + (char)in_RCX & 0x3fU));
          Nrows = Nrows + 4) {
        dxpose(in_RDI,in_RSI,in_RDX,(long)in_RCX,Nrows,Ncols);
        iffts(data_00,M_00,in_stack_ffffffffffffffb0);
        dxpose(in_RDI,in_RSI,in_RDX,(long)in_RCX,Nrows,Ncols);
      }
    }
  }
  return;
}

Assistant:

void ifft3d(float *data, long M3, long M2, long M){
/* Compute 2D complex ifft and return results in-place	*/
/* INPUTS */
/* *data = input data array	*/
/* M3 = log2 of fft size number of pages */
/* M2 = log2 of fft size number of rows */
/* M = log2 of fft size number of columns */
/* OUTPUTS */
/* *data = output data array	*/
long i1;
long i2;
const long N = POW2(M);
const long N2 = POW2(M2);
const long N3 = POW2(M3);
if((M3>0)&&(M2>0)&&(M>0)){
	iffts(data, M, N3*N2);
	if (M>2)
		for (i2=0; i2<N3; i2++){
			for (i1=0; i1<N; i1+=4){
				cxpose(data + i2*2*POW2(M2+M) + i1*2, N, Array2d[M2], N2, N2, 4);
				iffts(Array2d[M2], M2, 4);
				cxpose(Array2d[M2], N2, data + i2*2*POW2(M2+M) + i1*2, N, 4, N2);
			}
		}
	else{
		for (i2=0; i2<N3; i2++){
			cxpose(data + i2*2*POW2(M2+M), N, Array2d[M2], N2, N2, N);
			iffts(Array2d[M2], M2, N);
			cxpose(Array2d[M2], N2, data + i2*2*POW2(M2+M), N, N, N2);
		}
	}
	if ((M2+M)>2)
		for (i1=0; i1<POW2(M2+M); i1+=4){
			cxpose(data + i1*2, POW2(M2+M), Array2d[M3], N3, N3, 4);
			iffts(Array2d[M3], M3, 4);
			cxpose(Array2d[M3], N3, data + i1*2, POW2(M2+M), 4, N3);
		}
	else{
		cxpose(data, POW2(M2+M), Array2d[M3], N3, N3, POW2(M2+M));
		iffts(Array2d[M3], M3, POW2(M2+M));
		cxpose(Array2d[M3], N3, data, POW2(M2+M), POW2(M2+M), N3);
	}
}
else
	if(M3==0) ifft2d(data, M2, M);
	else
		if(M2==0) ifft2d(data, M3, M);
		else
			if(M==0) ifft2d(data, M3, M2);
}